

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattices.cpp
# Opt level: O2

void __thiscall VectorLattice_JoinSingleton_Test::TestBody(VectorLattice_JoinSingleton_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  initializer_list<bool> __l;
  initializer_list<bool> __l_00;
  undefined1 local_98 [8];
  Vec vector;
  Element elem;
  internal local_38 [8];
  AssertionResult gtest_ar_;
  AssertHelper local_20;
  
  vector._0_8_ = 2;
  ::wasm::analysis::Vector<wasm::analysis::Bool>::getBottom
            ((Element *)&vector.size,(Vector<wasm::analysis::Bool> *)local_98);
  elem.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
       = (_Bit_pointer)0x0;
  bVar1 = ::wasm::analysis::Vector<wasm::analysis::Bool>::join
                    ((Vector<wasm::analysis::Bool> *)local_98,(Element *)&vector.size,
                     (SingletonElement *)
                     &elem.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage);
  local_38[0] = (internal)!bVar1;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (!(bool)local_38[0]) {
    testing::Message::Message((Message *)&local_20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &elem.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_end_of_storage,local_38,
               (AssertionResult *)"vector.join(elem, Vec::SingletonElement(0, false))","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x1e6,(char *)elem.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    std::__cxx11::string::~string
              ((string *)
               &elem.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_end_of_storage);
    if ((long *)CONCAT62(local_20.data_._2_6_,local_20.data_._0_2_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT62(local_20.data_._2_6_,local_20.data_._0_2_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  local_20.data_._0_2_ = 0;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_20;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)
             &elem.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,__l,(allocator_type *)&gtest_ar_.message_);
  testing::internal::
  CmpHelperEQ<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>>
            (local_38,"elem","(std::vector{false, false})",
             (vector<bool,_std::allocator<bool>_> *)&vector.size,
             (vector<bool,_std::allocator<bool>_> *)
             &elem.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)
             &elem.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message
              ((Message *)
               &elem.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_end_of_storage);
    if (gtest_ar_._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x1e7,pcVar2);
    testing::internal::AssertHelper::operator=
              (&local_20,
               (Message *)
               &elem.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_end_of_storage);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (elem.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage != (_Bit_pointer)0x0) {
      (**(code **)(*elem.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                    ._M_end_of_storage + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  elem.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
       = (_Bit_pointer)0x1;
  local_38[0] = (internal)
                ::wasm::analysis::Vector<wasm::analysis::Bool>::join
                          ((Vector<wasm::analysis::Bool> *)local_98,(Element *)&vector.size,
                           (SingletonElement *)
                           &elem.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (!(bool)local_38[0]) {
    testing::Message::Message((Message *)&local_20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &elem.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_end_of_storage,local_38,
               (AssertionResult *)"vector.join(elem, Vec::SingletonElement(1, true))","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x1e9,(char *)elem.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    std::__cxx11::string::~string
              ((string *)
               &elem.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_end_of_storage);
    if ((long *)CONCAT62(local_20.data_._2_6_,local_20.data_._0_2_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT62(local_20.data_._2_6_,local_20.data_._0_2_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  local_20.data_._0_2_ = 0x100;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_20;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)
             &elem.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,__l_00,(allocator_type *)&gtest_ar_.message_);
  testing::internal::
  CmpHelperEQ<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>>
            (local_38,"elem","(std::vector{false, true})",
             (vector<bool,_std::allocator<bool>_> *)&vector.size,
             (vector<bool,_std::allocator<bool>_> *)
             &elem.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)
             &elem.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message
              ((Message *)
               &elem.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_end_of_storage);
    if (gtest_ar_._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x1ea,pcVar2);
    testing::internal::AssertHelper::operator=
              (&local_20,
               (Message *)
               &elem.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_end_of_storage);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (elem.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage != (_Bit_pointer)0x0) {
      (**(code **)(*elem.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                    ._M_end_of_storage + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)&vector.size);
  return;
}

Assistant:

TEST(VectorLattice, JoinSingleton) {
  using Vec = analysis::Vector<analysis::Bool>;
  Vec vector{analysis::Bool{}, 2};
  auto elem = vector.getBottom();

  EXPECT_FALSE(vector.join(elem, Vec::SingletonElement(0, false)));
  EXPECT_EQ(elem, (std::vector{false, false}));

  EXPECT_TRUE(vector.join(elem, Vec::SingletonElement(1, true)));
  EXPECT_EQ(elem, (std::vector{false, true}));
}